

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOUAmount.cpp
# Opt level: O0

bool __thiscall jbcoin::IOUAmount::operator<(IOUAmount *this,IOUAmount *other)

{
  bool rneg;
  bool lneg;
  IOUAmount *other_local;
  IOUAmount *this_local;
  
  this_local._7_1_ = this->mantissa_ < 0;
  if (this_local._7_1_ == other->mantissa_ < 0) {
    if (this->mantissa_ == 0) {
      this_local._7_1_ = 0 < other->mantissa_;
    }
    else if (other->mantissa_ == 0) {
      this_local._7_1_ = false;
    }
    else if (this->exponent_ <= other->exponent_) {
      if (this->exponent_ < other->exponent_) {
        this_local._7_1_ = !this_local._7_1_;
      }
      else {
        this_local._7_1_ = this->mantissa_ < other->mantissa_;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
IOUAmount::operator<(IOUAmount const& other) const
{
    // If the two amounts have different signs (zero is treated as positive)
    // then the comparison is true iff the left is negative.
    bool const lneg = mantissa_ < 0;
    bool const rneg = other.mantissa_ < 0;

    if (lneg != rneg)
        return lneg;

    // Both have same sign and the left is zero: the right must be
    // greater than 0.
    if (mantissa_ == 0)
        return other.mantissa_ > 0;

    // Both have same sign, the right is zero and the left is non-zero.
    if (other.mantissa_ == 0)
        return false;

    // Both have the same sign, compare by exponents:
    if (exponent_ > other.exponent_)
        return lneg;
    if (exponent_ < other.exponent_)
        return !lneg;

    // If equal exponents, compare mantissas
    return mantissa_ < other.mantissa_;
}